

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O3

TValue * debug_localname(lua_State *L,lua_Debug *ar,char **name,BCReg slot1)

{
  TValue *pTVar1;
  BCPos pc;
  char *pcVar2;
  ulong uVar3;
  cTValue *nextframe;
  long lVar4;
  uint uVar5;
  GCfunc *fn;
  TValue *local_40;
  
  uVar5 = (uint)ar;
  pTVar1 = (TValue *)((ulong)(L->stack).ptr32 + (ulong)(uVar5 & 0xffff) * 8);
  local_40 = pTVar1 + ((ulong)ar >> 0x10 & 0xffff);
  nextframe = (cTValue *)0x0;
  if (0xffff < uVar5) {
    nextframe = local_40;
  }
  fn = (GCfunc *)(ulong)(pTVar1->u32).lo;
  pc = debug_framepc(L,fn,nextframe);
  if (uVar5 < 0x10000) {
    local_40 = L->top;
  }
  if ((int)slot1 < 0) {
    if ((pc == 0xffffffff) || (uVar3 = (ulong)(fn->c).pc.ptr32, (*(byte *)(uVar3 - 0x1b) & 2) == 0))
    {
      return (TValue *)0x0;
    }
    uVar5 = (pTVar1->field_2).it & 7;
    if (uVar5 == 3) {
      local_40 = pTVar1;
    }
    lVar4 = -((long)(int)(pTVar1->field_2).it & 0xfffffffffffffff8U);
    if (uVar5 != 3) {
      lVar4 = 0;
    }
    pTVar1 = (TValue *)((long)pTVar1 + (ulong)(*(byte *)(uVar3 - 0x3a) - slot1) * 8 + lVar4);
    if (local_40 <= pTVar1) {
      return (TValue *)0x0;
    }
    *name = "(*vararg)";
    return pTVar1;
  }
  if (pc == 0xffffffff) {
    if (slot1 == 0) goto LAB_0011215f;
  }
  else {
    pcVar2 = debug_varname((GCproto *)(ulong)*(uint *)((ulong)(fn->c).pc.ptr32 - 4),pc,slot1 - 1);
    *name = pcVar2;
    if ((slot1 == 0) || (pcVar2 != (char *)0x0)) goto LAB_0011215f;
  }
  if (pTVar1 + slot1 < local_40) {
    *name = "(*temporary)";
  }
LAB_0011215f:
  return pTVar1 + slot1;
}

Assistant:

static TValue *debug_localname(lua_State *L, const lua_Debug *ar,
			       const char **name, BCReg slot1)
{
  uint32_t offset = (uint32_t)ar->i_ci & 0xffff;
  uint32_t size = (uint32_t)ar->i_ci >> 16;
  TValue *frame = tvref(L->stack) + offset;
  TValue *nextframe = size ? frame + size : NULL;
  GCfunc *fn = frame_func(frame);
  BCPos pc = debug_framepc(L, fn, nextframe);
  if (!nextframe) nextframe = L->top+LJ_FR2;
  if ((int)slot1 < 0) {  /* Negative slot number is for varargs. */
    if (pc != NO_BCPOS) {
      GCproto *pt = funcproto(fn);
      if ((pt->flags & PROTO_VARARG)) {
	slot1 = pt->numparams + (BCReg)(-(int)slot1);
	if (frame_isvarg(frame)) {  /* Vararg frame has been set up? (pc!=0) */
	  nextframe = frame;
	  frame = frame_prevd(frame);
	}
	if (frame + slot1+LJ_FR2 < nextframe) {
	  *name = "(*vararg)";
	  return frame+slot1;
	}
      }
    }
    return NULL;
  }
  if (pc != NO_BCPOS &&
      (*name = debug_varname(funcproto(fn), pc, slot1-1)) != NULL)
    ;
  else if (slot1 > 0 && frame + slot1+LJ_FR2 < nextframe)
    *name = "(*temporary)";
  return frame+slot1;
}